

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6adfde::ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::
ArgumentParserWithOutputVariable
          (ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable> *this)

{
  string_view name;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  memset(this,0,0x88);
  local_38._8_8_ = 0;
  local_38._M_unused._M_member_pointer = 0x30;
  pcStack_20 = std::
               _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
             ::_M_manager;
  name._M_str = "OUTPUT_VARIABLE";
  name._M_len = 0xf;
  ArgumentParser::Base::Bind((Base *)this,name,(KeywordAction *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

ArgumentParserWithOutputVariable()
    : CMakePathArgumentParser<Result>()
  {
    this->Bind("OUTPUT_VARIABLE"_s, &Result::Output);
  }